

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

FT_Error tt_loader_init(TT_Loader loader,TT_Size size,TT_GlyphSlot glyph,FT_Int32 load_flags,
                       FT_Bool glyf_table_only)

{
  undefined8 *puVar1;
  ushort uVar2;
  TT_Face face;
  FT_GlyphLoader loader_00;
  FT_Memory memory;
  FT_Face pFVar3;
  FT_DebugHook_Func p_Var4;
  FT_ULong FVar5;
  FT_UShort FVar6;
  FT_F2Dot14 FVar7;
  byte bVar8;
  int iVar9;
  FT_Error FVar10;
  uint uVar11;
  int iVar12;
  TT_ExecContext pTVar13;
  TT_DefArray pTVar14;
  FT_Long *pFVar15;
  FT_Vector *pFVar16;
  FT_Byte *pFVar17;
  FT_UShort *pFVar18;
  byte pedantic;
  ulong uVar19;
  long lVar20;
  FT_DebugHook_Func p_Var21;
  FT_UShort FVar22;
  TT_Face pTVar23;
  TT_GraphicsState *pTVar24;
  TT_Face pTVar25;
  TT_GraphicsState *pTVar26;
  undefined7 in_register_00000081;
  FT_Stream pFVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  undefined4 local_74;
  FT_Error local_6c;
  int local_68;
  uint local_64;
  FT_Stream local_60;
  undefined8 local_58;
  ulong local_50;
  FT_Driver local_48;
  TT_GlyphSlot local_40;
  TT_GlyphZone local_38;
  
  bVar30 = 0;
  face = (TT_Face)glyph->face;
  local_48 = (face->root).driver;
  pFVar27 = (face->root).stream;
  pTVar23 = (TT_Face)0x0;
  local_40 = glyph;
  memset(loader,0,0x178);
  if ((load_flags & 2U) != 0 || (int)CONCAT71(in_register_00000081,glyf_table_only) != 0)
  goto LAB_0016a498;
  pedantic = (byte)load_flags & 0x80;
  iVar12 = size->bytecode_ready;
  if (iVar12 < 0) {
    pFVar3 = (size->root).face;
    memory = pFVar3->memory;
    local_64 = load_flags;
    local_60 = pFVar27;
    ft_mem_free(memory,size->function_defs);
    size->function_defs = (TT_DefArray)0x0;
    ft_mem_free(memory,size->instruction_defs);
    size->instruction_defs = (TT_DefArray)0x0;
    ft_mem_free(memory,size->cvt);
    size->cvt = (FT_Long *)0x0;
    ft_mem_free(memory,size->storage);
    size->storage = (FT_Long *)0x0;
    if (size->context != (TT_ExecContext)0x0) {
      TT_Done_Context(size->context);
    }
    local_38 = &size->twilight;
    tt_glyphzone_done(local_38);
    size->bytecode_ready = -1;
    size->cvt_ready = -1;
    pTVar13 = TT_New_Context((TT_Driver)pFVar3->driver);
    size->context = pTVar13;
    uVar2 = *(ushort *)&pFVar3[1].extensions;
    size->max_function_defs = (uint)uVar2;
    size->max_instruction_defs = (uint)*(ushort *)((long)&pFVar3[1].extensions + 2);
    size->num_function_defs = 0;
    size->num_instruction_defs = 0;
    size->max_func = 0;
    size->max_ins = 0;
    size->cvt_size = (FT_ULong)pFVar3[4].generic.data;
    size->storage_size = *(FT_UShort *)((long)&pFVar3[1].autohint.finalizer + 6);
    (size->ttmetrics).rotated = '\0';
    (size->ttmetrics).stretched = '\0';
    (size->ttmetrics).compensations[2] = 0;
    (size->ttmetrics).compensations[3] = 0;
    (size->ttmetrics).compensations[0] = 0;
    (size->ttmetrics).compensations[1] = 0;
    pTVar23 = (TT_Face)0x0;
    local_58 = pFVar3;
    pTVar14 = (TT_DefArray)ft_mem_realloc(memory,0x28,0,(ulong)uVar2,(void *)0x0,&local_6c);
    size->function_defs = pTVar14;
    if (local_6c == 0) {
      pTVar23 = (TT_Face)0x0;
      pTVar14 = (TT_DefArray)
                ft_mem_realloc(memory,0x28,0,(ulong)size->max_instruction_defs,(void *)0x0,&local_6c
                              );
      size->instruction_defs = pTVar14;
      if (local_6c != 0) goto LAB_0016a841;
      pTVar23 = (TT_Face)0x0;
      pFVar15 = (FT_Long *)ft_mem_realloc(memory,8,0,size->cvt_size,(void *)0x0,&local_6c);
      size->cvt = pFVar15;
      if (local_6c != 0) goto LAB_0016a841;
      pTVar23 = (TT_Face)0x0;
      pFVar15 = (FT_Long *)
                ft_mem_realloc(memory,8,0,(ulong)size->storage_size,(void *)0x0,&local_6c);
      size->storage = pFVar15;
      if (local_6c != 0) goto LAB_0016a841;
      uVar11 = *(int *)((long)&local_58[1].autohint.finalizer + 4) + 4;
      (size->twilight).tags = (FT_Byte *)0x0;
      (size->twilight).contours = (FT_UShort *)0x0;
      *(undefined8 *)&(size->twilight).first_point = 0;
      (size->twilight).cur = (FT_Vector *)0x0;
      (size->twilight).orus = (FT_Vector *)0x0;
      (size->twilight).max_points = 0;
      (size->twilight).max_contours = 0;
      (size->twilight).n_points = 0;
      (size->twilight).n_contours = 0;
      (size->twilight).org = (FT_Vector *)0x0;
      (size->twilight).memory = memory;
      local_50 = (ulong)(uVar11 & 0xffff);
      pTVar23 = (TT_Face)0x0;
      pFVar16 = (FT_Vector *)ft_mem_realloc(memory,0x10,0,local_50,(void *)0x0,&local_68);
      (size->twilight).org = pFVar16;
      FVar22 = (FT_UShort)uVar11;
      if (local_68 == 0) {
        pTVar23 = (TT_Face)0x0;
        pFVar16 = (FT_Vector *)ft_mem_realloc(memory,0x10,0,local_50,(void *)0x0,&local_68);
        (size->twilight).cur = pFVar16;
        if (local_68 != 0) goto LAB_0016a827;
        pTVar23 = (TT_Face)0x0;
        pFVar16 = (FT_Vector *)ft_mem_realloc(memory,0x10,0,local_50,(void *)0x0,&local_68);
        (size->twilight).orus = pFVar16;
        if (local_68 != 0) goto LAB_0016a827;
        pTVar23 = (TT_Face)0x0;
        pFVar17 = (FT_Byte *)ft_mem_realloc(memory,1,0,local_50,(void *)0x0,&local_68);
        (size->twilight).tags = pFVar17;
        if (local_68 != 0) goto LAB_0016a827;
        pTVar23 = (TT_Face)0x0;
        pFVar18 = (FT_UShort *)ft_mem_realloc(memory,2,0,0,(void *)0x0,&local_68);
        (size->twilight).contours = pFVar18;
        if (local_68 != 0) goto LAB_0016a827;
        (size->twilight).max_points = FVar22;
        (size->twilight).max_contours = 0;
        local_6c = 0;
      }
      else {
LAB_0016a827:
        tt_glyphzone_done(local_38);
        local_6c = local_68;
        if (local_68 != 0) goto LAB_0016a841;
      }
      (size->twilight).n_points = FVar22;
      pTVar24 = &tt_default_graphics_state;
      pTVar26 = &size->GS;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        FVar22 = pTVar24->rp1;
        FVar6 = pTVar24->rp2;
        FVar7 = (pTVar24->dualVector).x;
        pTVar26->rp0 = pTVar24->rp0;
        pTVar26->rp1 = FVar22;
        pTVar26->rp2 = FVar6;
        (pTVar26->dualVector).x = FVar7;
        pTVar24 = (TT_GraphicsState *)((long)pTVar24 + ((ulong)bVar30 * -2 + 1) * 8);
        pTVar26 = (TT_GraphicsState *)((long)pTVar26 + (ulong)bVar30 * -0x10 + 8);
      }
      p_Var4 = ((local_58->driver->root).library)->debug_hooks[0];
      p_Var21 = TT_RunIns;
      if (p_Var4 != (FT_DebugHook_Func)0x0) {
        p_Var21 = p_Var4;
      }
      local_58[4].bbox.xMin = (FT_Pos)p_Var21;
      pTVar25 = (TT_Face)(size->root).face;
      pTVar13 = size->context;
      pTVar23 = pTVar25;
      iVar12 = TT_Load_Context(pTVar13,pTVar25,size);
      pFVar27 = local_60;
      load_flags = local_64;
      if (iVar12 == 0) {
        pTVar13->callTop = 0;
        pTVar13->top = 0;
        pTVar13->period = 0x40;
        pTVar13->phase = 0;
        pTVar13->threshold = 0;
        pTVar13->instruction_trap = '\0';
        pTVar13->F_dot_P = 0x4000;
        pTVar13->pedantic_hinting = pedantic;
        (pTVar13->metrics).x_ppem = 0;
        (pTVar13->metrics).y_ppem = 0;
        (pTVar13->tt_metrics).ppem = 0;
        (pTVar13->tt_metrics).scale = 0;
        (pTVar13->metrics).x_scale = 0;
        (pTVar13->metrics).y_scale = 0;
        (pTVar13->tt_metrics).ratio = 0x10000;
        FVar5 = pTVar25->font_program_size;
        pFVar17 = pTVar25->font_program;
        pTVar13->codeRangeTable[0].base = pFVar17;
        pTVar13->codeRangeTable[0].size = FVar5;
        pTVar13->codeRangeTable[1].base = (FT_Byte *)0x0;
        pTVar13->codeRangeTable[1].size = 0;
        pTVar13->codeRangeTable[2].base = (FT_Byte *)0x0;
        pTVar13->codeRangeTable[2].size = 0;
        if (pTVar25->font_program_size == 0) {
          size->bytecode_ready = 0;
        }
        else {
          pTVar13->code = pFVar17;
          pTVar13->codeSize = FVar5;
          pTVar13->IP = 0;
          pTVar13->curRange = 1;
          iVar12 = (*pTVar25->interpreter)(pTVar13);
          size->bytecode_ready = iVar12;
          pFVar27 = local_60;
          load_flags = local_64;
          if (iVar12 != 0) goto LAB_0016a860;
        }
        pFVar27 = local_60;
        pTVar23 = (TT_Face)size;
        TT_Save_Context(pTVar13,size);
        load_flags = local_64;
        iVar12 = 0;
      }
    }
    else {
LAB_0016a841:
      tt_size_done_bytecode(&size->root);
      pFVar27 = local_60;
      load_flags = local_64;
      iVar12 = local_6c;
    }
LAB_0016a860:
    pTVar25 = (TT_Face)0x0;
    if (iVar12 != 0) {
      return iVar12;
    }
    iVar9 = size->cvt_ready;
    uVar11 = load_flags;
    if (iVar9 < 0) {
      pFVar3 = (size->root).face;
      for (uVar11 = 0; uVar19 = (ulong)uVar11, uVar19 < size->cvt_size; uVar11 = uVar11 + 1) {
        lVar20 = (long)(int)(size->ttmetrics).scale *
                 (long)*(short *)(pFVar3[4].generic.finalizer + uVar19 * 2);
        size->cvt[uVar19] = (lVar20 >> 0x3f) + lVar20 + 0x8000 >> 0x10;
      }
      uVar2 = (size->twilight).n_points;
      for (lVar20 = 0; (ulong)uVar2 * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
        puVar1 = (undefined8 *)((long)&((size->twilight).org)->x + lVar20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&((size->twilight).cur)->x + lVar20);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      uVar2 = size->storage_size;
      for (uVar19 = 0; uVar2 != uVar19; uVar19 = uVar19 + 1) {
        size->storage[uVar19] = 0;
      }
      pTVar24 = &tt_default_graphics_state;
      pTVar26 = &size->GS;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        FVar22 = pTVar24->rp1;
        FVar6 = pTVar24->rp2;
        FVar7 = (pTVar24->dualVector).x;
        pTVar26->rp0 = pTVar24->rp0;
        pTVar26->rp1 = FVar22;
        pTVar26->rp2 = FVar6;
        (pTVar26->dualVector).x = FVar7;
        pTVar24 = (TT_GraphicsState *)((long)pTVar24 + ((ulong)bVar30 * -2 + 1) * 8);
        pTVar26 = (TT_GraphicsState *)((long)pTVar26 + (ulong)bVar30 * -0x10 + 8);
      }
      iVar9 = tt_size_run_prep(size,pedantic);
      pTVar23 = pTVar25;
      uVar11 = load_flags;
    }
  }
  else {
    iVar9 = size->cvt_ready;
    if (iVar9 < 0) goto LAB_0016a860;
    uVar11 = load_flags;
    if (iVar12 != 0) {
      return iVar12;
    }
  }
  local_64 = uVar11;
  local_60 = pFVar27;
  if (iVar9 != 0) {
    return iVar9;
  }
  pTVar13 = size->context;
  if (pTVar13 == (TT_ExecContext)0x0) {
    return 0x99;
  }
  bVar28 = *(int *)&local_48[2].root.library != 0x28;
  local_74 = (undefined4)CONCAT71((int7)((ulong)pTVar23 >> 8),(local_64 & 0xf0000) != 0x20000);
  local_58._4_4_ = (uint)((ulong)local_58 >> 0x20);
  if (bVar28) {
    bVar8 = 0;
    local_58 = (FT_Face)((ulong)local_58._4_4_ << 0x20);
  }
  else {
    bVar8 = (byte)(local_64 >> 0x12) & 1;
    local_58 = (FT_Face)CONCAT44(local_58._4_4_,local_74);
    local_74 = 0;
  }
  bVar28 = !bVar28 && ((local_64 & 0x70000) == 0 && (local_64 & 0xf0000) != 0x20000);
  pTVar13->vertical_lcd_lean = bVar8;
  FVar10 = TT_Load_Context(pTVar13,face,size);
  pFVar27 = local_60;
  if (FVar10 != 0) {
    return FVar10;
  }
  if (*(int *)&local_48[2].root.library == 0x28) {
    bVar29 = (FT_Bool)local_58 != pTVar13->subpixel_hinting_lean;
    if (bVar29) {
      pTVar13->subpixel_hinting_lean = (FT_Bool)local_58;
    }
    if (bVar28 != (bool)pTVar13->grayscale_cleartype) {
      pTVar13->grayscale_cleartype = bVar28;
      bVar29 = true;
    }
  }
  else {
    bVar29 = false;
  }
  if (pTVar13->grayscale == (FT_Bool)local_74) {
    if (bVar29) goto LAB_0016aa47;
  }
  else {
    pTVar13->grayscale = (FT_Bool)local_74;
LAB_0016aa47:
    for (uVar11 = 0; uVar19 = (ulong)uVar11, uVar19 < size->cvt_size; uVar11 = uVar11 + 1) {
      lVar20 = (long)(int)(size->ttmetrics).scale * (long)face->cvt[uVar19];
      size->cvt[uVar19] = (lVar20 >> 0x3f) + lVar20 + 0x8000 >> 0x10;
    }
    FVar10 = tt_size_run_prep(size,pedantic);
    if (FVar10 != 0) {
      return FVar10;
    }
  }
  uVar11 = *(uint *)&(pTVar13->GS).instruct_control;
  if ((uVar11 & 2) != 0) {
    pTVar24 = &tt_default_graphics_state;
    pTVar26 = &pTVar13->GS;
    for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
      FVar22 = pTVar24->rp1;
      FVar6 = pTVar24->rp2;
      FVar7 = (pTVar24->dualVector).x;
      pTVar26->rp0 = pTVar24->rp0;
      pTVar26->rp1 = FVar22;
      pTVar26->rp2 = FVar6;
      (pTVar26->dualVector).x = FVar7;
      pTVar24 = (TT_GraphicsState *)((long)pTVar24 + ((ulong)bVar30 * -2 + 1) * 8);
      pTVar26 = (TT_GraphicsState *)((long)pTVar26 + (ulong)bVar30 * -0x10 + 8);
    }
  }
  load_flags = local_64 | uVar11 * 2 & 2;
  pTVar13->pedantic_hinting = pedantic;
  loader->exec = pTVar13;
  loader->instructions = pTVar13->glyphIns;
LAB_0016a498:
  if (glyf_table_only == '\0') {
    loader_00 = local_40->internal->loader;
    FT_GlyphLoader_Rewind(loader_00);
    loader->gloader = loader_00;
  }
  loader->load_flags = (long)load_flags;
  loader->face = face;
  loader->size = size;
  loader->glyph = local_40;
  loader->stream = pFVar27;
  (loader->composites).head = (FT_ListNode)0x0;
  (loader->composites).tail = (FT_ListNode)0x0;
  return 0;
}

Assistant:

static FT_Error
  tt_loader_init( TT_Loader     loader,
                  TT_Size       size,
                  TT_GlyphSlot  glyph,
                  FT_Int32      load_flags,
                  FT_Bool       glyf_table_only )
  {
    TT_Face    face;
    FT_Stream  stream;

#ifdef TT_USE_BYTECODE_INTERPRETER
    FT_Error   error;
    FT_Bool    pedantic = FT_BOOL( load_flags & FT_LOAD_PEDANTIC );
#if defined TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY || \
    defined TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( (TT_Face)glyph->face );
#endif
#endif


    face   = (TT_Face)glyph->face;
    stream = face->root.stream;

    FT_ZERO( loader );

#ifdef TT_USE_BYTECODE_INTERPRETER

    /* load execution context */
    if ( IS_HINTED( load_flags ) && !glyf_table_only )
    {
      TT_ExecContext  exec;
      FT_Bool         grayscale = TRUE;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      FT_Bool         subpixel_hinting_lean;
      FT_Bool         grayscale_cleartype;
#endif

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      FT_Bool  subpixel_hinting = FALSE;

#if 0
      /* not used yet */
      FT_Bool  compatible_widths;
      FT_Bool  symmetrical_smoothing;
      FT_Bool  bgr;
      FT_Bool  vertical_lcd;
      FT_Bool  subpixel_positioned;
      FT_Bool  gray_cleartype;
#endif
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      FT_Bool  reexecute = FALSE;


      if ( size->bytecode_ready < 0 || size->cvt_ready < 0 )
      {
        error = tt_size_ready_bytecode( size, pedantic );
        if ( error )
          return error;
      }
      else if ( size->bytecode_ready )
        return size->bytecode_ready;
      else if ( size->cvt_ready )
        return size->cvt_ready;

      /* query new execution context */
      exec = size->context;
      if ( !exec )
        return FT_THROW( Could_Not_Find_Context );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
      {
        subpixel_hinting_lean =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   FT_RENDER_MODE_MONO               );
        grayscale_cleartype =
          FT_BOOL( subpixel_hinting_lean         &&
                   !( ( load_flags         &
                        FT_LOAD_TARGET_LCD )   ||
                      ( load_flags           &
                        FT_LOAD_TARGET_LCD_V ) ) );
        exec->vertical_lcd_lean =
          FT_BOOL( subpixel_hinting_lean    &&
                   ( load_flags           &
                     FT_LOAD_TARGET_LCD_V ) );
      }
      else
      {
        subpixel_hinting_lean   = FALSE;
        grayscale_cleartype     = FALSE;
        exec->vertical_lcd_lean = FALSE;
      }
#endif

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY

      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 )
      {
        subpixel_hinting = FT_BOOL( ( FT_LOAD_TARGET_MODE( load_flags ) !=
                                      FT_RENDER_MODE_MONO               )  &&
                                    SPH_OPTION_SET_SUBPIXEL                );

        if ( subpixel_hinting )
          grayscale = FALSE;
        else if ( SPH_OPTION_SET_GRAYSCALE )
        {
          grayscale        = TRUE;
          subpixel_hinting = FALSE;
        }
        else
          grayscale = FALSE;

        if ( FT_IS_TRICKY( glyph->face ) )
          subpixel_hinting = FALSE;

        exec->ignore_x_mode      = subpixel_hinting || grayscale;
        exec->rasterizer_version = SPH_OPTION_SET_RASTERIZER_VERSION;
        if ( exec->sph_tweak_flags & SPH_TWEAK_RASTERIZER_35 )
          exec->rasterizer_version = TT_INTERPRETER_VERSION_35;

#if 1
        exec->compatible_widths     = SPH_OPTION_SET_COMPATIBLE_WIDTHS;
        exec->symmetrical_smoothing = TRUE;
        exec->bgr                   = FALSE;
        exec->vertical_lcd          = FALSE;
        exec->subpixel_positioned   = TRUE;
        exec->gray_cleartype        = FALSE;
#else /* 0 */
        exec->compatible_widths =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_COMPATIBLE_WIDTHS );
        exec->symmetrical_smoothing =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_SYMMETRICAL_SMOOTHING );
        exec->bgr =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_BGR );
        exec->vertical_lcd =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_VERTICAL_LCD );
        exec->subpixel_positioned =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_SUBPIXEL_POSITIONED );
        exec->gray_cleartype =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_GRAY_CLEARTYPE );
#endif /* 0 */

      }
      else

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
        grayscale = FT_BOOL( !subpixel_hinting_lean               &&
                             FT_LOAD_TARGET_MODE( load_flags ) !=
                               FT_RENDER_MODE_MONO                );
      else
#endif
        grayscale = FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                               FT_RENDER_MODE_MONO             );

      error = TT_Load_Context( exec, face, size );
      if ( error )
        return error;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY

      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 )
      {
        /* a change from mono to subpixel rendering (and vice versa) */
        /* requires a re-execution of the CVT program                */
        if ( subpixel_hinting != exec->subpixel_hinting )
        {
          FT_TRACE4(( "tt_loader_init: subpixel hinting change,"
                      " re-executing `prep' table\n" ));

          exec->subpixel_hinting = subpixel_hinting;
          reexecute              = TRUE;
        }

        /* a change from mono to grayscale rendering (and vice versa) */
        /* requires a re-execution of the CVT program                 */
        if ( grayscale != exec->grayscale )
        {
          FT_TRACE4(( "tt_loader_init: grayscale hinting change,"
                      " re-executing `prep' table\n" ));

          exec->grayscale = grayscale;
          reexecute       = TRUE;
        }
      }
      else

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      {

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
        if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
        {
          /* a change from mono to subpixel rendering (and vice versa) */
          /* requires a re-execution of the CVT program                */
          if ( subpixel_hinting_lean != exec->subpixel_hinting_lean )
          {
            FT_TRACE4(( "tt_loader_init: subpixel hinting change,"
                        " re-executing `prep' table\n" ));

            exec->subpixel_hinting_lean = subpixel_hinting_lean;
            reexecute                   = TRUE;
          }

          /* a change from colored to grayscale subpixel rendering (and */
          /* vice versa) requires a re-execution of the CVT program     */
          if ( grayscale_cleartype != exec->grayscale_cleartype )
          {
            FT_TRACE4(( "tt_loader_init: grayscale subpixel hinting change,"
                        " re-executing `prep' table\n" ));

            exec->grayscale_cleartype = grayscale_cleartype;
            reexecute                 = TRUE;
          }
        }
#endif

        /* a change from mono to grayscale rendering (and vice versa) */
        /* requires a re-execution of the CVT program                 */
        if ( grayscale != exec->grayscale )
        {
          FT_TRACE4(( "tt_loader_init: grayscale hinting change,"
                      " re-executing `prep' table\n" ));

          exec->grayscale = grayscale;
          reexecute       = TRUE;
        }
      }

      if ( reexecute )
      {
        FT_UInt  i;


        for ( i = 0; i < size->cvt_size; i++ )
          size->cvt[i] = FT_MulFix( face->cvt[i], size->ttmetrics.scale );
        error = tt_size_run_prep( size, pedantic );
        if ( error )
          return error;
      }

      /* check whether the cvt program has disabled hinting */
      if ( exec->GS.instruct_control & 1 )
        load_flags |= FT_LOAD_NO_HINTING;

      /* load default graphics state -- if needed */
      if ( exec->GS.instruct_control & 2 )
        exec->GS = tt_default_graphics_state;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* check whether we have a font hinted for ClearType --           */
      /* note that this flag can also be modified in a glyph's bytecode */
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 &&
           exec->GS.instruct_control & 4                            )
        exec->ignore_x_mode = 0;
#endif

      exec->pedantic_hinting = FT_BOOL( load_flags & FT_LOAD_PEDANTIC );
      loader->exec = exec;
      loader->instructions = exec->glyphIns;
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    /* get face's glyph loader */
    if ( !glyf_table_only )
    {
      FT_GlyphLoader  gloader = glyph->internal->loader;


      FT_GlyphLoader_Rewind( gloader );
      loader->gloader = gloader;
    }

    loader->load_flags = (FT_ULong)load_flags;

    loader->face   = face;
    loader->size   = size;
    loader->glyph  = (FT_GlyphSlot)glyph;
    loader->stream = stream;

    loader->composites.head = NULL;
    loader->composites.tail = NULL;

    return FT_Err_Ok;
  }